

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void * xemmai::t_heap<xemmai::t_object>::f_map(size_t a_n)

{
  uint uVar1;
  void *pvVar2;
  _Link_type __z;
  iterator __x;
  unsigned_long *__args_1;
  pthread_mutex_t *__mutex;
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  *this;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar3;
  
  __mutex = (pthread_mutex_t *)0x0;
  pvVar2 = mmap((void *)0x0,a_n,3,0x22,-1,0);
  if (pvVar2 != (void *)0xffffffffffffffff) {
    return pvVar2;
  }
  pvVar2 = (void *)xemmai::portable::f_throw_system_error();
  uVar1 = pthread_mutex_lock(__mutex);
  if (uVar1 == 0) {
    return pvVar2;
  }
  this = (_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
          *)(ulong)uVar1;
  std::__throw_system_error(uVar1);
  __z = std::
        _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
        ::_M_create_node<xemmai::t_object*&,unsigned_long&>(this,(t_object **)a_n,__args_1);
  pVar3 = std::
          _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          ::_M_get_insert_unique_pos
                    ((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
                      *)this,(key_type *)&__z->_M_storage);
  __x._M_node = pVar3.first;
  if (pVar3.second == (_Base_ptr)0x0) {
    operator_delete(__z,0x30);
  }
  else {
    __x = std::
          _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          ::_M_insert_node((_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
                            *)this,__x._M_node,pVar3.second,__z);
  }
  return __x._M_node;
}

Assistant:

static void* f_map(size_t a_n)
	{
#ifdef __unix__
		auto p = mmap(NULL, a_n, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
		if (p == MAP_FAILED) portable::f_throw_system_error();
#endif
#ifdef _WIN32
		auto p = VirtualAlloc(NULL, a_n, MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
		if (p == NULL) throw std::system_error(GetLastError(), std::system_category());
#endif
		return p;
	}